

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>,_embree::sse2::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  float *pfVar1;
  BuildPrim *pBVar2;
  BuildPrim *pBVar3;
  RTCFormat RVar4;
  InstanceArray *pIVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  runtime_error *prVar12;
  ulong uVar13;
  ulong uVar14;
  Accel *pAVar15;
  Accel *pAVar16;
  uint uVar17;
  long lVar18;
  size_t i;
  ulong uVar19;
  float fVar20;
  uint uVar21;
  float fVar25;
  uint uVar26;
  float fVar27;
  uint uVar29;
  float fVar30;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar28;
  undefined1 auVar24 [16];
  float fVar31;
  undefined8 extraout_XMM1_Qa;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float fVar42;
  float in_XMM4_Dc;
  float fVar43;
  float in_XMM4_Dd;
  float fVar44;
  float in_XMM5_Da;
  float in_XMM5_Db;
  float in_XMM5_Dc;
  float in_XMM5_Dd;
  undefined1 in_XMM6 [16];
  undefined1 auVar45 [16];
  float fVar49;
  undefined1 in_XMM7 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar54;
  float fVar57;
  undefined1 auVar52 [16];
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar53 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 in_XMM9 [16];
  vfloat4 lower;
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 in_XMM10 [16];
  vfloat4 upper;
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float in_XMM11_Da;
  float fVar73;
  float in_XMM11_Db;
  float fVar74;
  float in_XMM11_Dc;
  float fVar75;
  float in_XMM11_Dd;
  float fVar76;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_1c9;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  anon_class_8_1_8991fb9c local_140;
  undefined8 local_138;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_130;
  anon_class_16_2_ed117de8_conflict24 local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  local_118;
  task_group_context local_d8;
  undefined1 local_58 [8];
  anon_class_16_2_ed117de8_conflict24 *paStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar21 = current->_begin;
  uVar19 = (ulong)uVar21;
  uVar26 = current->_end;
  if (uVar26 - uVar21 < 0x400) {
    auVar37 = _DAT_01feba00;
    if (uVar21 < uVar26) {
      pIVar5 = this->calculateBounds->mesh;
      pAVar15 = *(Accel **)&(pIVar5->super_Geometry).field_0x58;
      uStack_1b0 = 0x7f8000007f800000;
      local_1b8 = (undefined1  [8])0x7f8000007f800000;
      uVar13 = uVar19;
      do {
        uVar14 = (ulong)this->morton[uVar13].field_0.field_0.index;
        if ((pAVar15 != (Accel *)0x0) ||
           (*(int *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar5->object_ids).super_RawBufferView.stride * uVar14) != -1)) {
          if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
            pRVar6 = (pIVar5->l2w_buf).items;
            RVar4 = pRVar6->format;
            local_188 = (BBox<embree::Vec3fa> *)CONCAT44(in_XMM13_Db,in_XMM13_Da);
            uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)CONCAT44(in_XMM13_Dd,in_XMM13_Dc);
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar14;
                fStack_1c4 = *(float *)(pcVar7 + lVar18 + 0x10);
                local_1c8 = *(float *)(pcVar7 + lVar18);
                in_XMM14_Da = *(float *)(pcVar7 + lVar18 + 4);
                local_178 = *(float *)(pcVar7 + lVar18 + 8);
                local_198 = *(float *)(pcVar7 + lVar18 + 0xc);
                fStack_1c0 = *(float *)(pcVar7 + lVar18 + 0x20);
                fStack_1bc = 0.0;
                in_XMM14_Db = *(float *)(pcVar7 + lVar18 + 0x14);
                in_XMM14_Dc = *(float *)(pcVar7 + lVar18 + 0x24);
                in_XMM14_Dd = 0.0;
                fStack_174 = *(float *)(pcVar7 + lVar18 + 0x18);
                fStack_170 = *(float *)(pcVar7 + lVar18 + 0x28);
                fStack_16c = 0.0;
                fStack_194 = *(float *)(pcVar7 + lVar18 + 0x1c);
                fStack_190 = *(float *)(pcVar7 + lVar18 + 0x2c);
                fStack_18c = 0.0;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar14;
                local_1c8 = *(float *)(pcVar7 + lVar18);
                fStack_1c4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 4);
                fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 4) >> 0x20);
                fStack_1bc = 0.0;
                in_XMM14_Da = *(float *)(pcVar7 + lVar18 + 0xc);
                in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x10);
                in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x10) >> 0x20);
                in_XMM14_Dd = 0.0;
                local_178 = *(float *)(pcVar7 + lVar18 + 0x18);
                fStack_174 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
                fStack_170 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
                fStack_16c = 0.0;
                local_198 = *(float *)(pcVar7 + lVar18 + 0x24);
                fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x28);
                fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x28) >> 0x20);
                fStack_18c = 0.0;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar14;
              local_178 = *(float *)(pcVar7 + lVar18 + 0x10);
              fStack_174 = *(float *)((long)(pcVar7 + lVar18 + 0x10) + 4);
              local_1c8 = *(float *)(pcVar7 + lVar18);
              in_XMM14_Db = *(float *)(pcVar7 + lVar18 + 4);
              fStack_170 = *(float *)(pcVar7 + lVar18 + 8);
              in_XMM14_Da = *(float *)(pcVar7 + lVar18 + 0xc);
              fStack_1c4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x34);
              fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x34) >> 0x20);
              local_198 = *(float *)(pcVar7 + lVar18 + 0x18);
              fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
              fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
              fVar54 = *(float *)(pcVar7 + lVar18 + 0x24);
              fStack_1bc = *(float *)(pcVar7 + lVar18 + 0x28);
              fVar50 = *(float *)(pcVar7 + lVar18 + 0x2c);
              fVar59 = *(float *)(pcVar7 + lVar18 + 0x30);
              fVar61 = fVar59 * fVar59 + fVar50 * fVar50 + fVar54 * fVar54 + fStack_1bc * fStack_1bc
              ;
              auVar67 = rsqrtss(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
              fVar57 = auVar67._0_4_;
              fVar57 = fVar57 * fVar57 * fVar61 * -0.5 * fVar57 + fVar57 * 1.5;
              fStack_18c = fVar54 * fVar57;
              fStack_1bc = fStack_1bc * fVar57;
              in_XMM14_Dd = fVar50 * fVar57;
              fStack_16c = fVar57 * fVar59;
              in_XMM14_Dc = *(float *)(pcVar7 + lVar18 + 0x3c);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar14;
              pfVar1 = (float *)(pcVar7 + lVar18);
              local_1c8 = *pfVar1;
              fStack_1c4 = pfVar1[1];
              fStack_1c0 = pfVar1[2];
              fStack_1bc = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x10);
              in_XMM14_Da = *pfVar1;
              in_XMM14_Db = pfVar1[1];
              in_XMM14_Dc = pfVar1[2];
              in_XMM14_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x20);
              local_178 = *pfVar1;
              fStack_174 = pfVar1[1];
              fStack_170 = pfVar1[2];
              fStack_16c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x30);
              local_198 = *pfVar1;
              fStack_194 = pfVar1[1];
              fStack_190 = pfVar1[2];
              fStack_18c = pfVar1[3];
            }
            local_158._4_4_ = fStack_1c0;
            local_158._0_4_ = fStack_1c4;
            local_158._8_4_ = in_XMM14_Dc;
            local_158._12_4_ = 0;
            fVar63 = fStack_1bc * in_XMM14_Dd + fStack_16c * fStack_18c;
            fVar31 = fStack_1bc * in_XMM14_Dd - fStack_16c * fStack_18c;
            fVar64 = fStack_18c * fStack_18c + fStack_1bc * fStack_1bc + -in_XMM14_Dd * in_XMM14_Dd
                     + -fStack_16c * fStack_16c;
            fVar61 = fStack_18c * fStack_18c - fStack_1bc * fStack_1bc;
            fVar50 = in_XMM14_Dd * in_XMM14_Dd + fVar61 + -fStack_16c * fStack_16c;
            fVar59 = fStack_1bc * fStack_16c - in_XMM14_Dd * fStack_18c;
            fVar57 = in_XMM14_Dd * fStack_18c + fStack_1bc * fStack_16c;
            fVar54 = in_XMM14_Dd * fStack_16c + fStack_1bc * fStack_18c;
            fVar49 = in_XMM14_Dd * fStack_16c - fStack_1bc * fStack_18c;
            fVar61 = fStack_16c * fStack_16c + fVar61 + -in_XMM14_Dd * in_XMM14_Dd;
            fVar63 = fVar63 + fVar63;
            fVar59 = fVar59 + fVar59;
            fVar31 = fVar31 + fVar31;
            fVar54 = fVar54 + fVar54;
            fVar57 = fVar57 + fVar57;
            fVar49 = fVar49 + fVar49;
            fVar20 = fVar64 * 1.0 + fVar63 * 0.0 + fVar59 * 0.0;
            fVar25 = fVar64 * 0.0 + fVar63 * 1.0 + fVar59 * 0.0;
            fVar27 = fVar64 * 0.0 + fVar63 * 0.0 + fVar59 * 1.0;
            fVar30 = fVar64 * 0.0 + fVar63 * 0.0 + fVar59 * 0.0;
            fVar65 = fVar31 * 1.0 + fVar50 * 0.0 + fVar54 * 0.0;
            fVar70 = fVar31 * 0.0 + fVar50 * 1.0 + fVar54 * 0.0;
            fVar72 = fVar31 * 0.0 + fVar50 * 0.0 + fVar54 * 1.0;
            fVar76 = fVar31 * 0.0 + fVar50 * 0.0 + fVar54 * 0.0;
            fVar31 = fVar57 * 1.0 + fVar49 * 0.0 + fVar61 * 0.0;
            fVar34 = fVar57 * 0.0 + fVar49 * 1.0 + fVar61 * 0.0;
            fVar35 = fVar57 * 0.0 + fVar49 * 0.0 + fVar61 * 1.0;
            fVar36 = fVar57 * 0.0 + fVar49 * 0.0 + fVar61 * 0.0;
            fVar61 = local_1c8 * fVar20 + fVar65 * 0.0 + fVar31 * 0.0;
            fVar63 = local_1c8 * fVar25 + fVar70 * 0.0 + fVar34 * 0.0;
            fVar64 = local_1c8 * fVar27 + fVar72 * 0.0 + fVar35 * 0.0;
            fVar49 = local_1c8 * fVar30 + fVar76 * 0.0 + fVar36 * 0.0;
            fVar50 = in_XMM14_Da * fVar20 + in_XMM14_Db * fVar65 + fVar31 * 0.0;
            fVar54 = in_XMM14_Da * fVar25 + in_XMM14_Db * fVar70 + fVar34 * 0.0;
            fVar57 = in_XMM14_Da * fVar27 + in_XMM14_Db * fVar72 + fVar35 * 0.0;
            fVar59 = in_XMM14_Da * fVar30 + in_XMM14_Db * fVar76 + fVar36 * 0.0;
            in_XMM13_Da = local_178 * fVar20 + fStack_174 * fVar65 + fStack_170 * fVar31;
            in_XMM13_Db = local_178 * fVar25 + fStack_174 * fVar70 + fStack_170 * fVar34;
            in_XMM13_Dc = local_178 * fVar27 + fStack_174 * fVar72 + fStack_170 * fVar35;
            in_XMM13_Dd = local_178 * fVar30 + fStack_174 * fVar76 + fStack_170 * fVar36;
            fVar31 = local_198 * fVar20 + fStack_194 * fVar65 + fStack_190 * fVar31 +
                     fStack_1c4 + 0.0;
            fVar34 = local_198 * fVar25 + fStack_194 * fVar70 + fStack_190 * fVar34 +
                     fStack_1c0 + 0.0;
            fVar35 = local_198 * fVar27 + fStack_194 * fVar72 + fStack_190 * fVar35 +
                     in_XMM14_Dc + 0.0;
            fVar36 = local_198 * fVar30 + fStack_194 * fVar76 + fStack_190 * fVar36 + 0.0;
            local_168 = in_XMM14_Da;
            fStack_164 = in_XMM14_Db;
            fStack_160 = in_XMM14_Dc;
            fStack_15c = in_XMM14_Dd;
          }
          else {
            pRVar6 = (pIVar5->l2w_buf).items;
            RVar4 = pRVar6->format;
            fVar50 = in_XMM15_Da;
            fVar54 = in_XMM15_Db;
            fVar57 = in_XMM15_Dc;
            fVar59 = in_XMM15_Dd;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar14;
                fStack_1a4 = *(float *)(pcVar7 + lVar18 + 0x10);
                local_1a8 = *(float *)(pcVar7 + lVar18);
                in_XMM13_Da = *(float *)(pcVar7 + lVar18 + 8);
                in_XMM4_Da = *(float *)(pcVar7 + lVar18 + 0xc);
                fStack_1a0 = *(float *)(pcVar7 + lVar18 + 0x20);
                fStack_19c = 0.0;
                in_XMM13_Db = *(float *)(pcVar7 + lVar18 + 0x18);
                in_XMM13_Dc = *(float *)(pcVar7 + lVar18 + 0x28);
                in_XMM13_Dd = 0.0;
                in_XMM4_Db = *(float *)(pcVar7 + lVar18 + 0x1c);
                in_XMM4_Dc = *(float *)(pcVar7 + lVar18 + 0x2c);
                in_XMM4_Dd = 0.0;
                fVar50 = *(float *)(pcVar7 + lVar18 + 4);
                fVar54 = *(float *)(pcVar7 + lVar18 + 0x14);
                fVar57 = *(float *)(pcVar7 + lVar18 + 0x24);
                fVar59 = 0.0;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar14;
                local_1a8 = *(float *)(pcVar7 + lVar18);
                fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 4);
                fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 4) >> 0x20);
                fStack_19c = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar18 + 0x18);
                in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
                in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
                in_XMM13_Dd = 0.0;
                in_XMM4_Da = *(float *)(pcVar7 + lVar18 + 0x24);
                in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x28);
                in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x28) >> 0x20);
                in_XMM4_Dd = 0.0;
                fVar50 = *(float *)(pcVar7 + lVar18 + 0xc);
                fVar54 = *(float *)(pcVar7 + lVar18 + 0x18);
                fVar57 = *(float *)(pcVar7 + lVar18 + 0x1c);
                fVar59 = 0.0;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar14;
              in_XMM13_Da = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x10);
              in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x10) >> 0x20);
              local_1a8 = *(float *)(pcVar7 + lVar18);
              fVar54 = *(float *)(pcVar7 + lVar18 + 4);
              in_XMM13_Dc = *(float *)(pcVar7 + lVar18 + 8);
              fVar50 = *(float *)(pcVar7 + lVar18 + 0xc);
              fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x34);
              fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x34) >> 0x20);
              in_XMM4_Da = *(float *)(pcVar7 + lVar18 + 0x18);
              in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
              in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
              fVar57 = *(float *)(pcVar7 + lVar18 + 0x24);
              fStack_19c = *(float *)(pcVar7 + lVar18 + 0x28);
              fVar59 = *(float *)(pcVar7 + lVar18 + 0x2c);
              fVar61 = *(float *)(pcVar7 + lVar18 + 0x30);
              fVar64 = fVar61 * fVar61 + fVar59 * fVar59 + fVar57 * fVar57 + fStack_19c * fStack_19c
              ;
              auVar67 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
              fVar63 = auVar67._0_4_;
              fVar63 = fVar63 * fVar63 * fVar64 * -0.5 * fVar63 + fVar63 * 1.5;
              in_XMM4_Dd = fVar57 * fVar63;
              fStack_19c = fStack_19c * fVar63;
              fVar59 = fVar59 * fVar63;
              in_XMM13_Dd = fVar63 * fVar61;
              fVar57 = *(float *)(pcVar7 + lVar18 + 0x3c);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar14;
              pfVar1 = (float *)(pcVar7 + lVar18);
              local_1a8 = *pfVar1;
              fStack_1a4 = pfVar1[1];
              fStack_1a0 = pfVar1[2];
              fStack_19c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x10);
              fVar50 = *pfVar1;
              fVar54 = pfVar1[1];
              fVar57 = pfVar1[2];
              fVar59 = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x20);
              in_XMM13_Da = *pfVar1;
              in_XMM13_Db = pfVar1[1];
              in_XMM13_Dc = pfVar1[2];
              in_XMM13_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x30);
              in_XMM4_Da = *pfVar1;
              in_XMM4_Db = pfVar1[1];
              in_XMM4_Dc = pfVar1[2];
              in_XMM4_Dd = pfVar1[3];
            }
            local_188 = (BBox<embree::Vec3fa> *)CONCAT44(in_XMM13_Db,in_XMM13_Da);
            uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)CONCAT44(in_XMM13_Dd,in_XMM13_Dc);
            fVar61 = local_1a8;
            fVar63 = fStack_1a4;
            fVar64 = fStack_1a0;
            fVar49 = fStack_19c;
            fVar31 = in_XMM4_Da;
            fVar34 = in_XMM4_Db;
            fVar35 = in_XMM4_Dc;
            fVar36 = in_XMM4_Dd;
            in_XMM15_Da = fVar50;
            in_XMM15_Db = fVar54;
            in_XMM15_Dc = fVar57;
            in_XMM15_Dd = fVar59;
          }
          pAVar16 = pAVar15;
          if (pAVar15 == (Accel *)0x0) {
            pAVar16 = pIVar5->objects
                      [*(uint *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                                uVar14 * (pIVar5->object_ids).super_RawBufferView.stride)];
          }
          auVar67 = minps((undefined1  [16])(pAVar16->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar16->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar62 = maxps((undefined1  [16])(pAVar16->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar16->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar76 = auVar67._0_4_;
          fVar28 = auVar67._4_4_;
          fVar20 = auVar67._8_4_;
          fVar66 = fVar20 * in_XMM13_Da + fVar31;
          fVar68 = fVar20 * in_XMM13_Db + fVar34;
          fVar69 = fVar20 * in_XMM13_Dc + fVar35;
          fVar71 = fVar20 * in_XMM13_Dd + fVar36;
          fVar20 = fVar28 * fVar50 + fVar66;
          fVar25 = fVar28 * fVar54 + fVar68;
          fVar27 = fVar28 * fVar57 + fVar69;
          fVar30 = fVar28 * fVar59 + fVar71;
          fVar73 = fVar76 * fVar61;
          fVar74 = fVar76 * fVar63;
          fVar75 = fVar76 * fVar64;
          fVar76 = fVar76 * fVar49;
          auVar40._0_4_ = fVar73 + fVar20;
          auVar40._4_4_ = fVar74 + fVar25;
          auVar40._8_4_ = fVar75 + fVar27;
          auVar40._12_4_ = fVar76 + fVar30;
          auVar67 = minps(_DAT_01feb9f0,auVar40);
          auVar46 = maxps(_DAT_01feba00,auVar40);
          fVar65 = auVar62._0_4_;
          fVar70 = auVar62._4_4_;
          fVar72 = auVar62._8_4_;
          in_XMM3._0_4_ = fVar72 * in_XMM13_Da + fVar31;
          in_XMM3._4_4_ = fVar72 * in_XMM13_Db + fVar34;
          in_XMM3._8_4_ = fVar72 * in_XMM13_Dc + fVar35;
          in_XMM3._12_4_ = fVar72 * in_XMM13_Dd + fVar36;
          fVar31 = fVar28 * fVar50 + in_XMM3._0_4_;
          fVar34 = fVar28 * fVar54 + in_XMM3._4_4_;
          fVar35 = fVar28 * fVar57 + in_XMM3._8_4_;
          fVar36 = fVar28 * fVar59 + in_XMM3._12_4_;
          auVar52._0_4_ = fVar73 + fVar31;
          auVar52._4_4_ = fVar74 + fVar34;
          auVar52._8_4_ = fVar75 + fVar35;
          auVar52._12_4_ = fVar76 + fVar36;
          auVar67 = minps(auVar67,auVar52);
          auVar47 = maxps(auVar46,auVar52);
          fVar66 = fVar66 + fVar70 * fVar50;
          fVar68 = fVar68 + fVar70 * fVar54;
          fVar69 = fVar69 + fVar70 * fVar57;
          fVar71 = fVar71 + fVar70 * fVar59;
          in_XMM5_Da = fVar73 + fVar66;
          in_XMM5_Db = fVar74 + fVar68;
          in_XMM5_Dc = fVar75 + fVar69;
          in_XMM5_Dd = fVar76 + fVar71;
          auVar46._4_4_ = in_XMM5_Db;
          auVar46._0_4_ = in_XMM5_Da;
          auVar46._8_4_ = in_XMM5_Dc;
          auVar46._12_4_ = in_XMM5_Dd;
          auVar67 = minps(auVar67,auVar46);
          auVar62._4_4_ = in_XMM5_Db;
          auVar62._0_4_ = in_XMM5_Da;
          auVar62._8_4_ = in_XMM5_Dc;
          auVar62._12_4_ = in_XMM5_Dd;
          auVar46 = maxps(auVar47,auVar62);
          fVar50 = fVar70 * fVar50 + in_XMM3._0_4_;
          fVar54 = fVar70 * fVar54 + in_XMM3._4_4_;
          fVar57 = fVar70 * fVar57 + in_XMM3._8_4_;
          fVar59 = fVar70 * fVar59 + in_XMM3._12_4_;
          in_XMM11_Da = fVar73 + fVar50;
          in_XMM11_Db = fVar74 + fVar54;
          in_XMM11_Dc = fVar75 + fVar57;
          in_XMM11_Dd = fVar76 + fVar59;
          auVar47._4_4_ = in_XMM11_Db;
          auVar47._0_4_ = in_XMM11_Da;
          auVar47._8_4_ = in_XMM11_Dc;
          auVar47._12_4_ = in_XMM11_Dd;
          auVar67 = minps(auVar67,auVar47);
          auVar10._4_4_ = in_XMM11_Db;
          auVar10._0_4_ = in_XMM11_Da;
          auVar10._8_4_ = in_XMM11_Dc;
          auVar10._12_4_ = in_XMM11_Dd;
          auVar46 = maxps(auVar46,auVar10);
          fVar61 = fVar65 * fVar61;
          fVar63 = fVar65 * fVar63;
          fVar64 = fVar65 * fVar64;
          fVar65 = fVar65 * fVar49;
          auVar22._0_4_ = fVar20 + fVar61;
          auVar22._4_4_ = fVar25 + fVar63;
          auVar22._8_4_ = fVar27 + fVar64;
          auVar22._12_4_ = fVar30 + fVar65;
          auVar67 = minps(auVar67,auVar22);
          auVar46 = maxps(auVar46,auVar22);
          auVar32._0_4_ = fVar31 + fVar61;
          auVar32._4_4_ = fVar34 + fVar63;
          auVar32._8_4_ = fVar35 + fVar64;
          auVar32._12_4_ = fVar36 + fVar65;
          auVar67 = minps(auVar67,auVar32);
          auVar46 = maxps(auVar46,auVar32);
          in_XMM10._0_4_ = fVar66 + fVar61;
          in_XMM10._4_4_ = fVar68 + fVar63;
          in_XMM10._8_4_ = fVar69 + fVar64;
          in_XMM10._12_4_ = fVar71 + fVar65;
          auVar67 = minps(auVar67,in_XMM10);
          auVar46 = maxps(auVar46,in_XMM10);
          in_XMM9._0_4_ = fVar61 + fVar50;
          in_XMM9._4_4_ = fVar63 + fVar54;
          in_XMM9._8_4_ = fVar64 + fVar57;
          in_XMM9._12_4_ = fVar65 + fVar59;
          in_XMM6 = minps(auVar67,in_XMM9);
          in_XMM7 = maxps(auVar46,in_XMM9);
          in_XMM13_Da = (float)local_188;
          in_XMM13_Db = local_188._4_4_;
          in_XMM13_Dc = (float)uStack_180;
          in_XMM13_Dd = uStack_180._4_4_;
        }
        auVar23._0_4_ = in_XMM7._0_4_ + in_XMM6._0_4_;
        auVar23._4_4_ = in_XMM7._4_4_ + in_XMM6._4_4_;
        auVar23._8_4_ = in_XMM7._8_4_ + in_XMM6._8_4_;
        auVar23._12_4_ = in_XMM7._12_4_ + in_XMM6._12_4_;
        _local_1b8 = minps(_local_1b8,auVar23);
        auVar37 = maxps(auVar37,auVar23);
        uVar13 = uVar13 + 1;
      } while (uVar26 != uVar13);
    }
    else {
      uStack_1b0 = 0x7f8000007f800000;
      local_1b8 = (undefined1  [8])0x7f8000007f800000;
    }
    uVar13 = (ulong)current->_end;
    if (uVar21 < current->_end) {
      auVar38._0_4_ = auVar37._0_4_ - (float)local_1b8._0_4_;
      auVar38._4_4_ = auVar37._4_4_ - (float)local_1b8._4_4_;
      auVar38._8_4_ = auVar37._8_4_ - (float)uStack_1b0;
      auVar38._12_4_ = auVar37._12_4_ - uStack_1b0._4_4_;
      auVar37 = rcpps(in_XMM3,auVar38);
      fVar54 = auVar37._0_4_;
      fVar50 = auVar37._4_4_;
      fVar59 = auVar37._8_4_;
      fVar57 = auVar37._12_4_;
      fVar54 = (float)((uint)(((1.0 - auVar38._0_4_ * fVar54) * fVar54 + fVar54) * 1013.76) &
                      -(uint)(1e-19 < auVar38._0_4_));
      fVar50 = (float)((uint)(((1.0 - auVar38._4_4_ * fVar50) * fVar50 + fVar50) * 1013.76) &
                      -(uint)(1e-19 < auVar38._4_4_));
      fVar59 = (float)((uint)(((1.0 - auVar38._8_4_ * fVar59) * fVar59 + fVar59) * 1013.76) &
                      -(uint)(1e-19 < auVar38._8_4_));
      local_188 = (BBox<embree::Vec3fa> *)CONCAT44(fVar50,fVar54);
      uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)
                   CONCAT44((uint)(((1.0 - auVar38._12_4_ * fVar57) * fVar57 + fVar57) * 1013.76) &
                            -(uint)(1e-19 < auVar38._12_4_),fVar59);
      do {
        pIVar5 = this->calculateBounds->mesh;
        uVar13 = (ulong)this->morton[uVar19].field_0.field_0.index;
        pAVar15 = *(Accel **)&(pIVar5->super_Geometry).field_0x58;
        if ((pAVar15 != (Accel *)0x0) ||
           (*(int *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                    (pIVar5->object_ids).super_RawBufferView.stride * uVar13) != -1)) {
          pRVar6 = (pIVar5->l2w_buf).items;
          RVar4 = pRVar6->format;
          if ((pIVar5->super_Geometry).field_8.field_0x1 == '\x01') {
            fVar57 = fStack_1c4;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar13;
                local_1c8 = *(float *)(pcVar7 + lVar18);
                local_198 = *(float *)(pcVar7 + lVar18 + 4);
                local_178 = *(float *)(pcVar7 + lVar18 + 8);
                local_1a8 = *(float *)(pcVar7 + lVar18 + 0xc);
                fStack_1c0 = *(float *)(pcVar7 + lVar18 + 0x20);
                fStack_1bc = 0.0;
                fStack_194 = *(float *)(pcVar7 + lVar18 + 0x14);
                fStack_190 = *(float *)(pcVar7 + lVar18 + 0x24);
                fStack_18c = 0.0;
                fStack_174 = *(float *)(pcVar7 + lVar18 + 0x18);
                fStack_170 = *(float *)(pcVar7 + lVar18 + 0x28);
                fStack_16c = 0.0;
                fStack_1a4 = *(float *)(pcVar7 + lVar18 + 0x1c);
                fStack_1a0 = *(float *)(pcVar7 + lVar18 + 0x2c);
                fStack_19c = 0.0;
                fVar57 = *(float *)(pcVar7 + lVar18 + 0x10);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar13;
                local_1c8 = *(float *)(pcVar7 + lVar18);
                fStack_1c0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 4) >> 0x20);
                fStack_1bc = 0.0;
                local_198 = *(float *)(pcVar7 + lVar18 + 0xc);
                fStack_194 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x10);
                fStack_190 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x10) >> 0x20);
                fStack_18c = 0.0;
                local_178 = *(float *)(pcVar7 + lVar18 + 0x18);
                fStack_174 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
                fStack_170 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
                fStack_16c = 0.0;
                local_1a8 = *(float *)(pcVar7 + lVar18 + 0x24);
                fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x28);
                fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x28) >> 0x20);
                fStack_19c = 0.0;
                fVar57 = (float)*(undefined8 *)(pcVar7 + lVar18 + 4);
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar13;
              local_178 = *(float *)(pcVar7 + lVar18 + 0x10);
              fStack_174 = *(float *)((long)(pcVar7 + lVar18 + 0x10) + 4);
              local_1c8 = *(float *)(pcVar7 + lVar18);
              fStack_194 = *(float *)(pcVar7 + lVar18 + 4);
              fStack_170 = *(float *)(pcVar7 + lVar18 + 8);
              local_198 = *(float *)(pcVar7 + lVar18 + 0xc);
              local_1a8 = *(float *)(pcVar7 + lVar18 + 0x18);
              fStack_19c = *(float *)(pcVar7 + lVar18 + 0x24);
              fStack_1bc = *(float *)(pcVar7 + lVar18 + 0x28);
              fVar57 = *(float *)(pcVar7 + lVar18 + 0x2c);
              fVar61 = *(float *)(pcVar7 + lVar18 + 0x30);
              fVar64 = fVar61 * fVar61 +
                       fVar57 * fVar57 + fStack_19c * fStack_19c + fStack_1bc * fStack_1bc;
              auVar37 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
              fVar63 = auVar37._0_4_;
              fVar63 = fVar63 * fVar63 * fVar64 * -0.5 * fVar63 + fVar63 * 1.5;
              fStack_19c = fStack_19c * fVar63;
              fStack_1bc = fStack_1bc * fVar63;
              fStack_18c = fVar57 * fVar63;
              fStack_16c = fVar63 * fVar61;
              fVar57 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x34);
              fStack_1c4 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x34) >> 0x20);
              fStack_190 = *(float *)(pcVar7 + lVar18 + 0x3c);
              fStack_1a4 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
              fStack_1a0 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
              fStack_1c0 = fStack_1c4;
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar13;
              pfVar1 = (float *)(pcVar7 + lVar18);
              local_1c8 = *pfVar1;
              fVar57 = pfVar1[1];
              fStack_1c0 = pfVar1[2];
              fStack_1bc = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x10);
              local_198 = *pfVar1;
              fStack_194 = pfVar1[1];
              fStack_190 = pfVar1[2];
              fStack_18c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x20);
              local_178 = *pfVar1;
              fStack_174 = pfVar1[1];
              fStack_170 = pfVar1[2];
              fStack_16c = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x30);
              local_1a8 = *pfVar1;
              fStack_1a4 = pfVar1[1];
              fStack_1a0 = pfVar1[2];
              fStack_19c = pfVar1[3];
            }
            fStack_1c4 = fVar57;
            local_158._4_4_ = fStack_1c0;
            local_158._0_4_ = fVar57;
            local_158._8_4_ = fStack_190;
            local_158._12_4_ = 0;
            fVar31 = fStack_1bc * fStack_18c + fStack_16c * fStack_19c;
            fVar20 = fStack_1bc * fStack_18c - fStack_16c * fStack_19c;
            fVar49 = fStack_19c * fStack_19c + fStack_1bc * fStack_1bc + -fStack_18c * fStack_18c +
                     -fStack_16c * fStack_16c;
            fVar64 = fStack_19c * fStack_19c - fStack_1bc * fStack_1bc;
            fVar63 = fStack_18c * fStack_18c + fVar64 + -fStack_16c * fStack_16c;
            fVar34 = fStack_1bc * fStack_16c - fStack_18c * fStack_19c;
            fVar35 = fStack_18c * fStack_19c + fStack_1bc * fStack_16c;
            fVar61 = fStack_18c * fStack_16c + fStack_1bc * fStack_19c;
            fVar36 = fStack_18c * fStack_16c - fStack_1bc * fStack_19c;
            fVar64 = fStack_16c * fStack_16c + fVar64 + -fStack_18c * fStack_18c;
            fVar31 = fVar31 + fVar31;
            fVar34 = fVar34 + fVar34;
            fVar20 = fVar20 + fVar20;
            fVar61 = fVar61 + fVar61;
            fVar35 = fVar35 + fVar35;
            fVar36 = fVar36 + fVar36;
            local_168 = fVar49 * 1.0 + fVar31 * 0.0 + fVar34 * 0.0;
            fStack_164 = fVar49 * 0.0 + fVar31 * 1.0 + fVar34 * 0.0;
            fStack_160 = fVar49 * 0.0 + fVar31 * 0.0 + fVar34 * 1.0;
            fStack_15c = fVar49 * 0.0 + fVar31 * 0.0 + fVar34 * 0.0;
            fVar76 = fVar20 * 1.0 + fVar63 * 0.0 + fVar61 * 0.0;
            fVar66 = fVar20 * 0.0 + fVar63 * 1.0 + fVar61 * 0.0;
            fVar28 = fVar20 * 0.0 + fVar63 * 0.0 + fVar61 * 1.0;
            fVar68 = fVar20 * 0.0 + fVar63 * 0.0 + fVar61 * 0.0;
            fVar30 = fVar35 * 1.0 + fVar36 * 0.0 + fVar64 * 0.0;
            fVar65 = fVar35 * 0.0 + fVar36 * 1.0 + fVar64 * 0.0;
            fVar70 = fVar35 * 0.0 + fVar36 * 0.0 + fVar64 * 1.0;
            fVar72 = fVar35 * 0.0 + fVar36 * 0.0 + fVar64 * 0.0;
            fVar61 = local_1c8 * local_168 + fVar76 * 0.0 + fVar30 * 0.0;
            fVar64 = local_1c8 * fStack_164 + fVar66 * 0.0 + fVar65 * 0.0;
            fVar49 = local_1c8 * fStack_160 + fVar28 * 0.0 + fVar70 * 0.0;
            fVar63 = local_1c8 * fStack_15c + fVar68 * 0.0 + fVar72 * 0.0;
            fVar57 = local_1a8 * local_168 + fStack_1a4 * fVar76 + fStack_1a0 * fVar30 +
                     fVar57 + 0.0;
            fVar31 = local_1a8 * fStack_164 + fStack_1a4 * fVar66 + fStack_1a0 * fVar65 +
                     fStack_1c0 + 0.0;
            fVar34 = local_1a8 * fStack_160 + fStack_1a4 * fVar28 + fStack_1a0 * fVar70 +
                     fStack_190 + 0.0;
            fVar35 = local_1a8 * fStack_15c + fStack_1a4 * fVar68 + fStack_1a0 * fVar72 + 0.0;
            fVar36 = local_178 * local_168 + fStack_174 * fVar76 + fStack_170 * fVar30;
            fVar20 = local_178 * fStack_164 + fStack_174 * fVar66 + fStack_170 * fVar65;
            fVar25 = local_178 * fStack_160 + fStack_174 * fVar28 + fStack_170 * fVar70;
            fVar27 = local_178 * fStack_15c + fStack_174 * fVar68 + fStack_170 * fVar72;
            fVar30 = local_198 * local_168 + fStack_194 * fVar76 + fVar30 * 0.0;
            fVar65 = local_198 * fStack_164 + fStack_194 * fVar66 + fVar65 * 0.0;
            fVar70 = local_198 * fStack_160 + fStack_194 * fVar28 + fVar70 * 0.0;
            fVar72 = local_198 * fStack_15c + fStack_194 * fVar68 + fVar72 * 0.0;
          }
          else {
            fVar61 = in_XMM13_Da;
            fVar64 = in_XMM13_Db;
            fVar49 = in_XMM13_Dc;
            fVar63 = in_XMM13_Dd;
            fVar57 = in_XMM5_Da;
            fVar31 = in_XMM5_Db;
            fVar34 = in_XMM5_Dc;
            fVar35 = in_XMM5_Dd;
            fVar36 = in_XMM11_Da;
            fVar20 = in_XMM11_Db;
            fVar25 = in_XMM11_Dc;
            fVar27 = in_XMM11_Dd;
            fVar30 = in_XMM15_Da;
            fVar65 = in_XMM15_Db;
            fVar70 = in_XMM15_Dc;
            fVar72 = in_XMM15_Dd;
            if ((int)RVar4 < 0x9244) {
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar13;
                in_XMM15_Da = *(float *)(pcVar7 + lVar18 + 4);
                in_XMM11_Da = *(float *)(pcVar7 + lVar18 + 8);
                in_XMM5_Da = *(float *)(pcVar7 + lVar18 + 0xc);
                in_XMM15_Db = *(float *)(pcVar7 + lVar18 + 0x14);
                in_XMM15_Dc = *(float *)(pcVar7 + lVar18 + 0x24);
                in_XMM15_Dd = 0.0;
                in_XMM11_Db = *(float *)(pcVar7 + lVar18 + 0x18);
                in_XMM11_Dc = *(float *)(pcVar7 + lVar18 + 0x28);
                in_XMM11_Dd = 0.0;
                in_XMM5_Db = *(float *)(pcVar7 + lVar18 + 0x1c);
                in_XMM5_Dc = *(float *)(pcVar7 + lVar18 + 0x2c);
                in_XMM5_Dd = 0.0;
                fVar61 = *(float *)(pcVar7 + lVar18);
                fVar64 = *(float *)(pcVar7 + lVar18 + 0x10);
                fVar49 = *(float *)(pcVar7 + lVar18 + 0x20);
                fVar63 = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar18);
                in_XMM13_Db = *(float *)(pcVar7 + lVar18 + 0x10);
                in_XMM13_Dc = *(float *)(pcVar7 + lVar18 + 0x20);
                in_XMM13_Dd = 0.0;
                fVar57 = in_XMM5_Da;
                fVar31 = in_XMM5_Db;
                fVar34 = in_XMM5_Dc;
                fVar35 = in_XMM5_Dd;
                fVar36 = in_XMM11_Da;
                fVar20 = in_XMM11_Db;
                fVar25 = in_XMM11_Dc;
                fVar27 = in_XMM11_Dd;
                fVar30 = in_XMM15_Da;
                fVar65 = in_XMM15_Db;
                fVar70 = in_XMM15_Dc;
                fVar72 = in_XMM15_Dd;
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar6->ptr_ofs;
                lVar18 = pRVar6->stride * uVar13;
                fVar64 = (float)*(undefined8 *)(pcVar7 + lVar18 + 4);
                fVar49 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 4) >> 0x20);
                in_XMM15_Db = *(float *)(pcVar7 + lVar18 + 0x18);
                in_XMM15_Dc = *(float *)(pcVar7 + lVar18 + 0x1c);
                in_XMM15_Da = *(float *)(pcVar7 + lVar18 + 0xc);
                in_XMM15_Dd = 0.0;
                in_XMM11_Da = *(float *)(pcVar7 + lVar18 + 0x18);
                in_XMM11_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
                in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
                in_XMM11_Dd = 0.0;
                in_XMM5_Da = *(float *)(pcVar7 + lVar18 + 0x24);
                in_XMM5_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x28);
                in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x28) >> 0x20);
                in_XMM5_Dd = 0.0;
                fVar61 = *(float *)(pcVar7 + lVar18);
                fVar63 = 0.0;
                in_XMM13_Da = *(float *)(pcVar7 + lVar18);
                in_XMM13_Db = fVar64;
                in_XMM13_Dc = fVar49;
                in_XMM13_Dd = 0.0;
                fVar57 = in_XMM5_Da;
                fVar31 = in_XMM5_Db;
                fVar34 = in_XMM5_Dc;
                fVar35 = in_XMM5_Dd;
                fVar36 = in_XMM11_Da;
                fVar20 = in_XMM11_Db;
                fVar25 = in_XMM11_Dc;
                fVar27 = in_XMM11_Dd;
                fVar30 = in_XMM15_Da;
                fVar65 = in_XMM15_Db;
                fVar70 = in_XMM15_Dc;
                fVar72 = in_XMM15_Dd;
              }
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar13;
              in_XMM11_Da = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x10);
              in_XMM11_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x10) >> 0x20);
              fVar61 = *(float *)(pcVar7 + lVar18);
              in_XMM15_Db = *(float *)(pcVar7 + lVar18 + 4);
              in_XMM11_Dc = *(float *)(pcVar7 + lVar18 + 8);
              in_XMM15_Da = *(float *)(pcVar7 + lVar18 + 0xc);
              fVar64 = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x34);
              fVar49 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x34) >> 0x20);
              in_XMM5_Da = *(float *)(pcVar7 + lVar18 + 0x18);
              in_XMM5_Db = (float)*(undefined8 *)(pcVar7 + lVar18 + 0x1c);
              in_XMM5_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar18 + 0x1c) >> 0x20);
              fVar57 = *(float *)(pcVar7 + lVar18 + 0x24);
              fVar63 = *(float *)(pcVar7 + lVar18 + 0x28);
              fVar31 = *(float *)(pcVar7 + lVar18 + 0x2c);
              fVar34 = *(float *)(pcVar7 + lVar18 + 0x30);
              fVar36 = fVar34 * fVar34 + fVar31 * fVar31 + fVar57 * fVar57 + fVar63 * fVar63;
              auVar37 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
              fVar35 = auVar37._0_4_;
              fVar35 = fVar35 * fVar35 * fVar36 * -0.5 * fVar35 + fVar35 * 1.5;
              in_XMM5_Dd = fVar57 * fVar35;
              fVar63 = fVar63 * fVar35;
              in_XMM15_Dd = fVar31 * fVar35;
              in_XMM11_Dd = fVar35 * fVar34;
              in_XMM15_Dc = *(float *)(pcVar7 + lVar18 + 0x3c);
              in_XMM13_Da = fVar61;
              in_XMM13_Db = fVar64;
              in_XMM13_Dc = fVar49;
              in_XMM13_Dd = fVar63;
              fVar57 = in_XMM5_Da;
              fVar31 = in_XMM5_Db;
              fVar34 = in_XMM5_Dc;
              fVar35 = in_XMM5_Dd;
              fVar36 = in_XMM11_Da;
              fVar20 = in_XMM11_Db;
              fVar25 = in_XMM11_Dc;
              fVar27 = in_XMM11_Dd;
              fVar30 = in_XMM15_Da;
              fVar65 = in_XMM15_Db;
              fVar70 = in_XMM15_Dc;
              fVar72 = in_XMM15_Dd;
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar6->ptr_ofs;
              lVar18 = pRVar6->stride * uVar13;
              pfVar1 = (float *)(pcVar7 + lVar18);
              fVar61 = *pfVar1;
              fVar64 = pfVar1[1];
              fVar49 = pfVar1[2];
              fVar63 = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x10);
              in_XMM15_Da = *pfVar1;
              in_XMM15_Db = pfVar1[1];
              in_XMM15_Dc = pfVar1[2];
              in_XMM15_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x20);
              in_XMM11_Da = *pfVar1;
              in_XMM11_Db = pfVar1[1];
              in_XMM11_Dc = pfVar1[2];
              in_XMM11_Dd = pfVar1[3];
              pfVar1 = (float *)(pcVar7 + lVar18 + 0x30);
              in_XMM5_Da = *pfVar1;
              in_XMM5_Db = pfVar1[1];
              in_XMM5_Dc = pfVar1[2];
              in_XMM5_Dd = pfVar1[3];
              in_XMM13_Da = fVar61;
              in_XMM13_Db = fVar64;
              in_XMM13_Dc = fVar49;
              in_XMM13_Dd = fVar63;
              fVar57 = in_XMM5_Da;
              fVar31 = in_XMM5_Db;
              fVar34 = in_XMM5_Dc;
              fVar35 = in_XMM5_Dd;
              fVar36 = in_XMM11_Da;
              fVar20 = in_XMM11_Db;
              fVar25 = in_XMM11_Dc;
              fVar27 = in_XMM11_Dd;
              fVar30 = in_XMM15_Da;
              fVar65 = in_XMM15_Db;
              fVar70 = in_XMM15_Dc;
              fVar72 = in_XMM15_Dd;
            }
          }
          if (pAVar15 == (Accel *)0x0) {
            pAVar15 = pIVar5->objects
                      [*(uint *)((pIVar5->object_ids).super_RawBufferView.ptr_ofs +
                                uVar13 * (pIVar5->object_ids).super_RawBufferView.stride)];
          }
          auVar67 = minps((undefined1  [16])(pAVar15->super_AccelData).bounds.bounds0.lower.field_0,
                          (undefined1  [16])(pAVar15->super_AccelData).bounds.bounds1.lower.field_0)
          ;
          auVar37 = maxps((undefined1  [16])(pAVar15->super_AccelData).bounds.bounds0.upper.field_0,
                          (undefined1  [16])(pAVar15->super_AccelData).bounds.bounds1.upper.field_0)
          ;
          fVar74 = auVar67._0_4_;
          fVar55 = auVar67._4_4_;
          fVar76 = auVar67._8_4_;
          fVar51 = fVar76 * fVar36 + fVar57;
          fVar56 = fVar76 * fVar20 + fVar31;
          fVar58 = fVar76 * fVar25 + fVar34;
          fVar60 = fVar76 * fVar27 + fVar35;
          fVar76 = fVar55 * fVar30 + fVar51;
          fVar66 = fVar55 * fVar65 + fVar56;
          fVar28 = fVar55 * fVar70 + fVar58;
          fVar68 = fVar55 * fVar72 + fVar60;
          fVar69 = fVar74 * fVar61;
          fVar71 = fVar74 * fVar64;
          fVar73 = fVar74 * fVar49;
          fVar74 = fVar74 * fVar63;
          fVar75 = fVar69 + fVar76;
          fVar42 = fVar71 + fVar66;
          fVar43 = fVar73 + fVar28;
          fVar44 = fVar74 + fVar68;
          auVar8._4_4_ = fVar42;
          auVar8._0_4_ = fVar75;
          auVar8._8_4_ = fVar43;
          auVar8._12_4_ = fVar44;
          auVar67 = minps(_DAT_01feb9f0,auVar8);
          auVar9._4_4_ = fVar42;
          auVar9._0_4_ = fVar75;
          auVar9._8_4_ = fVar43;
          auVar9._12_4_ = fVar44;
          auVar46 = maxps(_DAT_01feba00,auVar9);
          fVar75 = auVar37._0_4_;
          fVar42 = auVar37._4_4_;
          fVar43 = auVar37._8_4_;
          fVar57 = fVar43 * fVar36 + fVar57;
          fVar31 = fVar43 * fVar20 + fVar31;
          fVar34 = fVar43 * fVar25 + fVar34;
          fVar35 = fVar43 * fVar27 + fVar35;
          fVar36 = fVar55 * fVar30 + fVar57;
          fVar20 = fVar55 * fVar65 + fVar31;
          fVar25 = fVar55 * fVar70 + fVar34;
          fVar27 = fVar55 * fVar72 + fVar35;
          auVar39._0_4_ = fVar69 + fVar36;
          auVar39._4_4_ = fVar71 + fVar20;
          auVar39._8_4_ = fVar73 + fVar25;
          auVar39._12_4_ = fVar74 + fVar27;
          auVar37 = minps(auVar67,auVar39);
          auVar67 = maxps(auVar46,auVar39);
          fVar51 = fVar51 + fVar42 * fVar30;
          fVar56 = fVar56 + fVar42 * fVar65;
          fVar58 = fVar58 + fVar42 * fVar70;
          fVar60 = fVar60 + fVar42 * fVar72;
          auVar45._0_4_ = fVar69 + fVar51;
          auVar45._4_4_ = fVar71 + fVar56;
          auVar45._8_4_ = fVar73 + fVar58;
          auVar45._12_4_ = fVar74 + fVar60;
          auVar37 = minps(auVar37,auVar45);
          auVar67 = maxps(auVar67,auVar45);
          fVar57 = fVar42 * fVar30 + fVar57;
          fVar31 = fVar42 * fVar65 + fVar31;
          fVar34 = fVar42 * fVar70 + fVar34;
          fVar35 = fVar42 * fVar72 + fVar35;
          auVar33._0_4_ = fVar69 + fVar57;
          auVar33._4_4_ = fVar71 + fVar31;
          auVar33._8_4_ = fVar73 + fVar34;
          auVar33._12_4_ = fVar74 + fVar35;
          auVar37 = minps(auVar37,auVar33);
          auVar67 = maxps(auVar67,auVar33);
          fVar61 = fVar75 * fVar61;
          fVar64 = fVar75 * fVar64;
          fVar49 = fVar75 * fVar49;
          fVar75 = fVar75 * fVar63;
          auVar24._0_4_ = fVar76 + fVar61;
          auVar24._4_4_ = fVar66 + fVar64;
          auVar24._8_4_ = fVar28 + fVar49;
          auVar24._12_4_ = fVar68 + fVar75;
          auVar37 = minps(auVar37,auVar24);
          auVar67 = maxps(auVar67,auVar24);
          auVar41._0_4_ = fVar36 + fVar61;
          auVar41._4_4_ = fVar20 + fVar64;
          auVar41._8_4_ = fVar25 + fVar49;
          auVar41._12_4_ = fVar27 + fVar75;
          auVar37 = minps(auVar37,auVar41);
          auVar67 = maxps(auVar67,auVar41);
          auVar53._0_4_ = fVar51 + fVar61;
          auVar53._4_4_ = fVar56 + fVar64;
          auVar53._8_4_ = fVar58 + fVar49;
          auVar53._12_4_ = fVar60 + fVar75;
          auVar37 = minps(auVar37,auVar53);
          auVar67 = maxps(auVar67,auVar53);
          auVar48._0_4_ = fVar61 + fVar57;
          auVar48._4_4_ = fVar64 + fVar31;
          auVar48._8_4_ = fVar49 + fVar34;
          auVar48._12_4_ = fVar75 + fVar35;
          in_XMM9 = minps(auVar37,auVar48);
          in_XMM10 = maxps(auVar67,auVar48);
        }
        uVar21 = (uint)(((in_XMM10._0_4_ + in_XMM9._0_4_) - (float)local_1b8._0_4_) * fVar54);
        uVar26 = (uint)(((in_XMM10._4_4_ + in_XMM9._4_4_) - (float)local_1b8._4_4_) * fVar50);
        uVar29 = (uint)(((in_XMM10._8_4_ + in_XMM9._8_4_) - (float)uStack_1b0) * fVar59);
        uVar21 = (uVar21 << 0x10 | uVar21) & 0x30000ff;
        uVar21 = (uVar21 << 8 | uVar21) & 0x300f00f;
        uVar26 = (uVar26 << 0x10 | uVar26) & 0x30000ff;
        uVar17 = (uVar26 << 8 | uVar26) & 0x300f00f;
        uVar26 = (uVar29 << 0x10 | uVar29) & 0x30000ff;
        uVar26 = (uVar26 << 8 | uVar26) & 0x300f00f;
        this->morton[uVar19].field_0.field_0.code =
             ((uVar26 << 4 | uVar26) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar17 << 4 | uVar17) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar21 << 4 | uVar21) & 0x30c30c3) * 5 & 0x9249249;
        uVar19 = uVar19 + 1;
        uVar13 = (ulong)current->_end;
      } while (uVar19 < uVar13);
    }
    uVar21 = current->_begin;
    if (uVar21 != (uint)uVar13) {
      pBVar2 = this->morton + uVar13;
      pBVar3 = this->morton + uVar21;
      uVar19 = (long)(uVar13 * 8 + (ulong)uVar21 * -8) >> 3;
      lVar18 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar3,pBVar2,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar3,pBVar2);
      return;
    }
  }
  else {
    local_58 = (undefined1  [8])0x7f8000007f800000;
    paStack_50 = (anon_class_16_2_ed117de8_conflict24 *)0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_140.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize(&local_d8);
    local_138._4_4_ = uVar21;
    local_138._0_4_ = uVar26;
    local_130 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_118.my_real_body = &local_128;
    local_128.reduction = BBox<embree::Vec3fa>::merge;
    local_128.func = &local_140;
    local_118.my_reduction = BBox<embree::Vec3fa>::merge;
    local_118.my_value.lower.field_0._0_8_ = local_58;
    local_118.my_value.lower.field_0._8_8_ = paStack_50;
    local_118.my_value.upper.field_0._0_8_ = local_48;
    local_118.my_value.upper.field_0._8_8_ = uStack_40;
    local_118.my_identity_element = (BBox<embree::Vec3fa> *)local_58;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_138,&local_118,&local_1c9,&local_d8);
    local_188 = (BBox<embree::Vec3fa> *)local_118.my_value.lower.field_0._0_8_;
    uStack_180 = (anon_class_16_2_ed117de8_conflict24 *)local_118.my_value.lower.field_0._8_8_;
    uStack_1b0 = local_118.my_value.upper.field_0._8_8_;
    local_1b8 = (undefined1  [8])local_118.my_value.upper.field_0._0_8_;
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar11 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    auVar37._8_8_ = extraout_XMM1_Qb;
    auVar37._0_8_ = extraout_XMM1_Qa;
    local_118.my_identity_element = local_188;
    local_118.my_real_body = uStack_180;
    auVar67._0_4_ = (float)local_1b8._0_4_ - (float)local_188;
    auVar67._4_4_ = (float)local_1b8._4_4_ - local_188._4_4_;
    auVar67._8_4_ = (float)uStack_1b0 - (float)uStack_180;
    auVar67._12_4_ = uStack_1b0._4_4_ - uStack_180._4_4_;
    auVar37 = rcpps(auVar37,auVar67);
    fVar54 = auVar37._0_4_;
    fVar50 = auVar37._4_4_;
    fVar59 = auVar37._8_4_;
    fVar57 = auVar37._12_4_;
    local_118._24_4_ =
         (uint)(((1.0 - auVar67._8_4_ * fVar59) * fVar59 + fVar59) * 1013.76) &
         -(uint)(1e-19 < auVar67._8_4_);
    local_118._28_4_ =
         (uint)(((1.0 - auVar67._12_4_ * fVar57) * fVar57 + fVar57) * 1013.76) &
         -(uint)(1e-19 < auVar67._12_4_);
    local_118.my_reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
         CONCAT44((uint)(((1.0 - auVar67._4_4_ * fVar50) * fVar50 + fVar50) * 1013.76) &
                  -(uint)(1e-19 < auVar67._4_4_),
                  (uint)(((1.0 - auVar67._0_4_ * fVar54) * fVar54 + fVar54) * 1013.76) &
                  -(uint)(1e-19 < auVar67._0_4_));
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    uStack_1b0 = 0;
    local_1b8._0_4_ = current->_begin;
    local_1b8._4_4_ = current->_end;
    local_138 = this;
    local_130 = &local_118;
    tbb::detail::r1::initialize(&local_d8);
    local_58._4_4_ = local_1b8._0_4_;
    local_58._0_4_ = local_1b8._4_4_;
    paStack_50 = (anon_class_16_2_ed117de8_conflict24 *)0x400;
    local_128.reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&local_138;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)local_58,(anon_class_8_1_898bcfc2 *)&local_128,&local_1c9,
          &local_d8);
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar11 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }